

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_method.h
# Opt level: O0

duk_ret_t dukglue::detail::
          MethodInfo<false,_Dog,_void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::MethodRuntime::call_native_method(duk_context *ctx)

{
  Dog *obj_00;
  duk_context *ctx_00;
  undefined1 local_50 [8];
  type bakedArgs;
  MethodHolder *method_holder;
  Dog *obj;
  void *method_holder_void;
  void *obj_void;
  duk_context *ctx_local;
  
  duk_push_this(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_c456);
  obj_00 = (Dog *)duk_get_pointer(ctx,-1);
  if (obj_00 == (Dog *)0x0) {
    duk_error_raw(ctx,-4,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_method.h"
                  ,0x5b,"Invalid native object for \'this\'");
  }
  duk_pop_2(ctx);
  duk_push_current_function(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_da1a);
  bakedArgs.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._8_8_ = duk_require_pointer(ctx,-1);
  if ((void *)bakedArgs.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl.field_2._8_8_ == (void *)0x0) {
    duk_error_raw(ctx,-6,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_method.h"
                  ,0x66,"Method pointer missing?!");
  }
  duk_pop_2(ctx);
  get_stack_values<std::__cxx11::string_const&>((type *)local_50,(detail *)ctx,ctx_00);
  MethodInfo<false,Dog,void,std::__cxx11::string_const&>::MethodRuntime::
  actually_call<void,std::__cxx11::string>
            ((MethodRuntime *)ctx,
             *(duk_context **)
              bakedArgs.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl.field_2._8_8_,
             *(MethodType *)
              (bakedArgs.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl.field_2._8_8_ + 8),obj_00,(type *)local_50);
  std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         local_50);
  return 0;
}

Assistant:

static duk_ret_t call_native_method(duk_context* ctx)
				{
					// get this.obj_ptr
					duk_push_this(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "obj_ptr");
					void* obj_void = duk_get_pointer(ctx, -1);
					if (obj_void == nullptr) {
						duk_error(ctx, DUK_RET_REFERENCE_ERROR, "Invalid native object for 'this'");
						return DUK_RET_REFERENCE_ERROR;
					}

					duk_pop_2(ctx); // pop this.obj_ptr and this

					// get current_function.method_info
					duk_push_current_function(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "method_holder");
					void* method_holder_void = duk_require_pointer(ctx, -1);
					if (method_holder_void == nullptr) {
						duk_error(ctx, DUK_RET_TYPE_ERROR, "Method pointer missing?!");
						return DUK_RET_TYPE_ERROR;
					}

					duk_pop_2(ctx);

					// (should always be valid unless someone is intentionally messing with this.obj_ptr...)
					Cls* obj = static_cast<Cls*>(obj_void);
					MethodHolder* method_holder = static_cast<MethodHolder*>(method_holder_void);

					// read arguments and call method
                    auto bakedArgs = dukglue::detail::get_stack_values<Ts...>(ctx);
					actually_call(ctx, method_holder->method, obj, bakedArgs);
					return std::is_void<RetType>::value ? 0 : 1;
				}